

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  char *in_R9;
  bool bVar5;
  
  if (p < limit) {
    uVar2 = 0;
    uVar4 = 0;
    pcVar3 = p + 1;
    do {
      bVar1 = pcVar3[-1];
      if ((char)bVar1 < '\0') {
        uVar4 = uVar4 | (bVar1 & 0x7f) << ((byte)uVar2 & 0x1f);
      }
      else {
        uVar4 = uVar4 | (uint)bVar1 << ((byte)uVar2 & 0x1f);
        *value = uVar4;
        in_R9 = pcVar3;
      }
      if (-1 < (char)bVar1) {
        return in_R9;
      }
      if (0x15 < uVar2) {
        return (char *)0x0;
      }
      uVar2 = uVar2 + 7;
      bVar5 = pcVar3 < limit;
      pcVar3 = pcVar3 + 1;
    } while (bVar5);
  }
  return (char *)0x0;
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const unsigned char*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}